

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cc
# Opt level: O0

base_learner * binary_setup(options_i *options,vw *all)

{
  learner<char,_example> *base;
  learner<char,_char> *in_RDI;
  learner<char,_example> *ret;
  option_group_definition new_options;
  bool binary;
  string *in_stack_fffffffffffffe28;
  vw *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  typed_option<bool> *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  string local_178 [39];
  allocator local_151;
  string local_150 [32];
  typed_option<bool> local_130;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [63];
  byte local_19;
  vw *local_8;
  
  local_19 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Binary loss",&local_79);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"binary",&local_151);
  VW::config::make_option<bool>(in_stack_fffffffffffffe38,(bool *)in_stack_fffffffffffffe30);
  VW::config::typed_option<bool>::keep(&local_130,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_178,"report loss as binary classification on -1,1",
             (allocator *)&stack0xfffffffffffffe87);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            ((option_group_definition *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),in_stack_fffffffffffffe78
            );
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe87);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffffe30);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  (*(code *)**(undefined8 **)in_RDI)(in_RDI,local_58);
  if ((local_19 & 1) == 0) {
    local_8 = (vw *)0x0;
  }
  else {
    setup_base((options_i *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    LEARNER::as_singleline<char,char>(in_RDI);
    base = LEARNER::init_learner<char,example,LEARNER::learner<char,example>>
                     ((learner<char,_example> *)in_stack_fffffffffffffe30,
                      (_func_void_char_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffffe28,
                      (_func_void_char_ptr_learner<char,_example>_ptr_example_ptr *)0x399a65);
    in_stack_fffffffffffffe30 = (vw *)LEARNER::make_base<char,example>(base);
    local_8 = in_stack_fffffffffffffe30;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffe30);
  return (base_learner *)local_8;
}

Assistant:

LEARNER::base_learner* binary_setup(options_i& options, vw& all)
{
  bool binary = false;
  option_group_definition new_options("Binary loss");
  new_options.add(make_option("binary", binary).keep().help("report loss as binary classification on -1,1"));
  options.add_and_parse(new_options);

  if (!binary)
    return nullptr;

  LEARNER::learner<char, example>& ret =
      LEARNER::init_learner(as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);
  return make_base(ret);
}